

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_alloc.c
# Opt level: O1

void dwarf_dealloc(Dwarf_Debug dbg,Dwarf_Ptr space,Dwarf_Unsigned alloc_type)

{
  void **rootp;
  int iVar1;
  void *pvVar2;
  void *key;
  
  if (space != (Dwarf_Ptr)0x0) {
    if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
      dw_empty_errlist_item((Dwarf_Error)space);
      return;
    }
    rootp = &dbg->de_alloc_tree;
    if ((alloc_type == 1) && (dbg->de_alloc_tree != (void *)0x0)) {
      pvVar2 = _dwarf_tfind(space,rootp,simple_compare_function);
      if (space < (Dwarf_Ptr)0x11) {
        return;
      }
      if (pvVar2 == (void *)0x0) {
        return;
      }
    }
    else if (space < (Dwarf_Ptr)0x11) {
      return;
    }
    if (*(ushort *)((long)space + -6) == alloc_type) {
      if (alloc_type == 0xe) {
        iVar1 = *(int *)((long)space + 0x10);
        if (iVar1 == 1) {
          _dwarf_failsafe_error.er_errval = 0x111;
          _dwarf_error_destructor(space);
        }
        else if (iVar1 == 2) {
          _dwarf_remove_from_staticerrlist((Dwarf_Ptr *)space);
        }
        if (iVar1 != 1) {
LAB_00195e4d:
          if (alloc_instance_basics[(uint)alloc_type & 0x7f].specialdestructor !=
              (_func_void_void_ptr *)0x0) {
            (*alloc_instance_basics[(uint)alloc_type & 0x7f].specialdestructor)(space);
          }
          if (*rootp != (void *)0x0) {
            _dwarf_tdelete(space,rootp,simple_compare_function);
          }
          *(undefined8 *)((long)space + -0x10) = 0xfeadbeef;
          *(undefined4 *)((long)space + -8) = 0;
          free((void *)((long)space + -0x10));
          return;
        }
      }
      else if ((uint)alloc_type < 0x42) goto LAB_00195e4d;
    }
  }
  return;
}

Assistant:

void
dwarf_dealloc(Dwarf_Debug dbg,
    Dwarf_Ptr space, Dwarf_Unsigned alloc_type)
{
    unsigned int type = 0;
    char * malloc_addr = 0;
    struct reserve_data_s * r = 0;
#if 0
    Dwarf_Bool check_errmsg_list = FALSE;
#endif

    if (!space) {
#ifdef DEBUG_ALLOC
        printf("DEALLOC does nothing, space NULL line %d %s\n",
            __LINE__,__FILE__);
        fflush(stdout);
#endif /* DEBUG_ALLOC*/
        return;
    }
    if (IS_INVALID_DBG(dbg)) {
        /*  App error, or an app that failed in a
            dwarf_init*() or dwarf_elf_init*() call.

        */
        dw_empty_errlist_item(space);
#ifdef DEBUG_ALLOC
        printf( "DEALLOC dbg NULL line %d %s\n",
            __LINE__,__FILE__);
        fflush(stdout);
#endif /* DEBUG_ALLOC*/
        return;
    }
    if (space == (Dwarf_Ptr)&_dwarf_failsafe_error) {
#ifdef DEBUG_ALLOC
        printf("DEALLOC failsafe requested at 0x%lx. "
            "ignore. line %d %s\n",
            (unsigned long)space,
            __LINE__,__FILE__);
        fflush(stdout);
        return;
#endif /* DEBUG_ALLOC*/
    }
    if (dbg && dbg->de_alloc_tree) {
        /*  If it's a string in debug_info etc doing
            (char *)space - DW_RESERVE is totally bogus. */
        if (alloc_type == DW_DLA_STRING &&
            string_is_in_debug_section(dbg,space)) {
            /*  A string pointer may point into .debug_info or
                .debug_string etc.
                So must not be freed.  And strings have
                no need of a specialdestructor().
                Mostly a historical mistake here.
                Corrected in libdwarf March 14,2020. */
#ifdef DEBUG_ALLOC
            printf( "DEALLOC string in section, no dealloc "
                "line %d %s\n", __LINE__,__FILE__);
            fflush(stdout);
#endif /* DEBUG_ALLOC*/
            return;
        }
    }
    /*  Otherwise it might be allocated string so it is ok
        do the (char *)space - DW_RESERVE  */

    /*  If it's a DW_DLA_STRING case and erroneous
        the following pointer operations might
        result in a coredump if the pointer
        is to the beginning of a string section.
        If not DW_DLA_STRING
        no correctly written caller could coredump
        here.  */
    if ((uintptr_t)space > DW_RESERVE) {
        malloc_addr = (char *)space - DW_RESERVE;
    } else {
        /* Impossible */
        return;
    }
    r =(struct reserve_data_s *)malloc_addr;
    if (dbg && dbg != r->rd_dbg) {
        /*  Mixed up or originally a no_dbg alloc */
#ifdef DEBUG_ALLOC
        printf("DEALLOC find was NULL  dbg 0x%lx "
            "rd_dbg 0x%lx space 0x%lx line %d %s\n",
            (unsigned long)dbg,
            (unsigned long)r->rd_dbg,
            (unsigned long)space,
            __LINE__,__FILE__);
        fflush(stdout);
#endif /* DEBUG_ALLOC*/
    }
    if (dbg && alloc_type != r->rd_type) {
        /*  Something is mixed up. */
#ifdef DEBUG_ALLOC
        printf("DEALLOC does nothing, type 0x%lx rd_type 0x%lx"
            " space 0x%lx line %d %s\n",
            (unsigned long)alloc_type,
            (unsigned long)r->rd_type,
            (unsigned long)space,
            __LINE__,__FILE__);
        fflush(stdout);
#endif /* DEBUG_ALLOC*/
        return;
    }
    if (alloc_type == DW_DLA_ERROR) {
        Dwarf_Error ep = (Dwarf_Error)space;

        if (ep->er_static_alloc == DE_STATIC) {
            /*  This is special, malloc arena
                was exhausted or a NULL dbg
                was used for the error because the real
                dbg was unavailable.
                There is nothing to delete, really.
                Set er_errval to signal that the
                space was dealloc'd. */
            _dwarf_failsafe_error.er_errval =
                DW_DLE_FAILSAFE_ERRVAL;
            _dwarf_error_destructor(ep);
#ifdef DEBUG_ALLOC
            printf("DEALLOC does nothing, DE_STATIC line %d %s\n",
                __LINE__,__FILE__);
            fflush(stdout);
#endif /* DEBUG_ALLOC*/
            return;
        }
        if (ep->er_static_alloc == DE_MALLOC) {
            /*  This is special, we had no arena
                but have a full special area as normal. */
#if 0
            check_errmsg_list = TRUE;
#endif
#ifdef DEBUG_ALLOC
            printf("DEALLOC does free, DE_MALLOC line %d %s\n",
                __LINE__,__FILE__);
            fflush(stdout);
#endif /* DEBUG_ALLOC*/
            _dwarf_remove_from_staticerrlist(space);
        }
        /* Was normal alloc, use normal dealloc. */
        /* DW_DLA_ERROR has a specialdestructor */
    }
    /*  alloc types are a defined library-private
        set of integers. Less than 256 of them. */
    type = (unsigned int)alloc_type;
#if DEBUG_ALLOC
    if (dbg != r->rd_dbg) {
        printf("DEALLOC  dbg != rd_dbg"
            " going ahead line %d %s\n",
            __LINE__,__FILE__);
        fflush(stdout);
    }
    printf("libdwarfdetector DEALLOC ret 0x%lx type 0x%x "
        "size %lu line %d %s\n",
        (unsigned long)space,(unsigned)type,
        (unsigned long)r->rd_length,__LINE__,__FILE__);
#endif /* DEBUG_ALLOC*/
    if (type >= ALLOC_AREA_INDEX_TABLE_MAX) {
        /* internal or user app error */
#ifdef DEBUG_ALLOC
        printf("DEALLOC does nothing, type too big %lu line %d %s\n",
            (unsigned long)type,
            __LINE__,__FILE__);
        fflush(stdout);
#endif /* DEBUG_ALLOC*/
        return;
    }
    if (alloc_instance_basics[type].specialdestructor) {
        alloc_instance_basics[type].specialdestructor(space);
    }
    if (dbg && dbg->de_alloc_tree) {
        /*  The 'space' pointer we get points after the
            reserve space.  The key is 'space'
            and address to free
            is just a few bytes before 'space'. */
        void *key = space;

        dwarf_tdelete(key,&dbg->de_alloc_tree,
            simple_compare_function);
        /*  If dwarf_tdelete returns NULL it might mean
            a) tree is empty.
            b) If hashsearch, then a single chain might
                now be empty,
                so we do not know of a 'parent node'.
            c) We did not find that key, we did nothing.

            In any case, we simply don't worry about it.
            Not Supposed To Happen. */
    }
    r->rd_dbg  = (void *)(uintptr_t)0xfeadbeef;
    r->rd_length = 0;
    r->rd_type = 0;
    free(malloc_addr);
    return;
}